

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialect_detection.cpp
# Opt level: O3

bool __thiscall
duckdb::CSVSniffer::RefineCandidateNextChunk(CSVSniffer *this,ColumnCountScanner *candidate)

{
  bool bVar1;
  bool bVar2;
  vector<duckdb::LogicalType,_true> *pvVar3;
  idx_t iVar4;
  ulong uVar5;
  pointer pLVar6;
  pointer pLVar7;
  int iVar8;
  undefined4 extraout_var;
  reference pvVar10;
  ulong uVar11;
  size_type __n;
  vector<duckdb::ColumnCount,_true> *this_00;
  long lVar9;
  
  iVar8 = (*(candidate->super_BaseScanner)._vptr_BaseScanner[2])(candidate);
  lVar9 = CONCAT44(extraout_var,iVar8);
  if (*(long *)(lVar9 + 0x68) != 0) {
    this_00 = (vector<duckdb::ColumnCount,_true> *)(lVar9 + 0x40);
    __n = 0;
    do {
      pvVar3 = (this->set_columns).types;
      if ((pvVar3 != (vector<duckdb::LogicalType,_true> *)0x0) &&
         ((pvVar3->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
          super__Vector_impl_data._M_start !=
          (pvVar3->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
          super__Vector_impl_data._M_finish)) {
        pvVar10 = vector<duckdb::ColumnCount,_true>::operator[](this_00,__n);
        uVar5 = pvVar10->number_of_columns;
        bVar1 = this->options->null_padding;
        bVar2 = (this->options->ignore_errors).value;
        pvVar10 = vector<duckdb::ColumnCount,_true>::operator[](this_00,__n);
        pvVar3 = (this->set_columns).types;
        if (pvVar3 == (vector<duckdb::LogicalType,_true> *)0x0) {
          return true;
        }
        pLVar6 = (pvVar3->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pLVar7 = (pvVar3->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        if (pLVar6 == pLVar7) {
          return true;
        }
        if (bVar2 != false) {
          return true;
        }
        uVar11 = ((long)pLVar7 - (long)pLVar6 >> 3) * -0x5555555555555555;
        if (uVar11 - uVar5 == 0) {
          return true;
        }
        return (bool)(uVar11 < uVar5 & bVar1 | pvVar10->last_value_always_empty + uVar11 == uVar5);
      }
      iVar4 = this->max_columns_found;
      pvVar10 = vector<duckdb::ColumnCount,_true>::operator[](this_00,__n);
      if ((((iVar4 != pvVar10->number_of_columns) && (this->options->null_padding == false)) &&
          ((this->options->ignore_errors).value == false)) &&
         (pvVar10 = vector<duckdb::ColumnCount,_true>::operator[](this_00,__n),
         pvVar10->is_comment != true)) {
        return false;
      }
      __n = __n + 1;
    } while (__n < *(ulong *)(lVar9 + 0x68));
  }
  return true;
}

Assistant:

bool CSVSniffer::RefineCandidateNextChunk(ColumnCountScanner &candidate) const {
	auto &sniffed_column_counts = candidate.ParseChunk();
	for (idx_t i = 0; i < sniffed_column_counts.result_position; i++) {
		if (set_columns.IsSet()) {
			return !set_columns.IsCandidateUnacceptable(sniffed_column_counts[i].number_of_columns,
			                                            options.null_padding, options.ignore_errors.GetValue(),
			                                            sniffed_column_counts[i].last_value_always_empty);
		}
		if (max_columns_found != sniffed_column_counts[i].number_of_columns &&
		    (!options.null_padding && !options.ignore_errors.GetValue() && !sniffed_column_counts[i].is_comment)) {
			return false;
		}
	}
	return true;
}